

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void vocerr(voccxdef *ctx,int err,char *f,...)

{
  undefined8 in_RCX;
  int err_00;
  long in_RDI;
  vocerr_va_info *in_R8;
  voccxdef *in_R9;
  vocerr_va_info info;
  va_list argptr;
  __va_list_tag *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  __va_list_tag *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  vocerr_va_info *in_stack_fffffffffffffe88;
  voccxdef *in_stack_fffffffffffffe90;
  
  err_00 = (int)((ulong)in_RCX >> 0x20);
  if (*(int *)(in_RDI + 0x119c) < 1) {
    vocerr_va_prep(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                   in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    vocerr_va(in_R9,in_R8,err_00,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  }
  return;
}

Assistant:

void vocerr(voccxdef *ctx, int err, char *f, ...)
{
    va_list argptr;
    struct vocerr_va_info info;

    /*
     *   If the unknown word flag is set, suppress this error, because
     *   we're going to be trying the whole parsing from the beginning
     *   again anyway.  
     */
    if (ctx->voccxunknown > 0)
        return;

    /* prepare to format the message */
    va_start(argptr, f);
    vocerr_va_prep(ctx, &info, err, f, argptr);
    va_end(argptr);

    /* call the general vocerr formatter */
    va_start(argptr, f);
    vocerr_va(ctx, &info, err, f, argptr);
    va_end(argptr);
}